

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O0

uintptr_t ngx_radix128tree_find(ngx_radix_tree_t *tree,u_char *key)

{
  ngx_radix_node_t *local_38;
  ngx_radix_node_t *node;
  ngx_uint_t i;
  uintptr_t value;
  u_char bit;
  u_char *key_local;
  ngx_radix_tree_t *tree_local;
  
  node = (ngx_radix_node_t *)0x0;
  value._7_1_ = 0x80;
  i = 0xffffffffffffffff;
  local_38 = tree->root;
  while (local_38 != (ngx_radix_node_t *)0x0) {
    if (local_38->value != 0xffffffffffffffff) {
      i = local_38->value;
    }
    if ((key[(long)node] & value._7_1_) == 0) {
      local_38 = local_38->left;
    }
    else {
      local_38 = local_38->right;
    }
    value._7_1_ = (byte)((int)(uint)value._7_1_ >> 1);
    if (value._7_1_ == 0) {
      node = (ngx_radix_node_t *)((long)&node->right + 1);
      value._7_1_ = 0x80;
    }
  }
  return i;
}

Assistant:

uintptr_t
ngx_radix128tree_find(ngx_radix_tree_t *tree, u_char *key)
{
    u_char             bit;
    uintptr_t          value;
    ngx_uint_t         i;
    ngx_radix_node_t  *node;

    i = 0;
    bit = 0x80;
    value = NGX_RADIX_NO_VALUE;
    node = tree->root;

    while (node) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            value = node->value;
        }

        if (key[i] & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;

        if (bit == 0) {
            i++;
            bit = 0x80;
        }
    }

    return value;
}